

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O0

void __thiscall sophia_interface::LUEXEC(sophia_interface *this)

{
  int iVar1;
  long lVar2;
  double *pdVar3;
  int *piVar4;
  sophia_interface *this_00;
  allocator<char> *this_01;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  double local_138;
  double PDEV;
  int local_128;
  int J_1;
  int I_1;
  undefined1 local_fc [12];
  int MFRAG;
  int IP1_1;
  double local_e8;
  double local_e0;
  double QMAX;
  int local_d0;
  int IP1;
  int KC;
  bool repeat150;
  int IP;
  int iStack_bc;
  bool repeat140;
  int MBE;
  int J;
  int I;
  int NSAV;
  int MCONS;
  allocator local_99;
  string local_98 [32];
  double local_78;
  double PS [6] [2];
  sophia_interface *this_local;
  
  memset(&local_78,0,0x60);
  MSTU[0x17] = 0;
  if (0 < MSTU[0xb]) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"LULIST(0), Method removed.",&local_99);
    LUERRM(this,-1,(string *)local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  MSTU[0x1e] = MSTU[0x1e] + 1;
  MSTU[0] = 0;
  MSTU[1] = 0;
  MSTU[2] = 0;
  if (MSTU[0x10] < 1) {
    MSTU[0x59] = 0;
  }
  I = 1;
  J = this->N;
  for (MBE = 0; MBE < this->N; MBE = MBE + 1) {
    if ((0 < this->K[0][MBE]) && (this->K[0][MBE] < 0xb)) {
      for (iStack_bc = 0; iStack_bc < 4; iStack_bc = iStack_bc + 1) {
        PS[(long)iStack_bc + -1][1] = this->P[iStack_bc][MBE] + PS[(long)iStack_bc + -1][1];
      }
      iVar1 = LUCHGE(this,this->K[1][MBE]);
      PS[4][1] = (double)iVar1 + PS[4][1];
    }
  }
  PARU[0x14] = PS[2][1];
  this_00 = this;
  LUPREP(this,0);
  IP = 0;
  do {
    repeat150 = false;
    IP = IP + 1;
    KC = 0;
    do {
      IP1._3_1_ = 0;
      iVar1 = KC + 1;
      local_d0 = 0;
      if ((0 < this->K[0][KC]) && (this->K[0][KC] < 0xb)) {
        lVar2 = (long)KC;
        this_00 = this;
        KC = iVar1;
        local_d0 = LUCOMP(this,this->K[1][lVar2]);
        iVar1 = KC;
      }
      KC = iVar1;
      if (local_d0 != 0) {
        if (KCHG[1][local_d0 + -1] == 0) {
          if ((0 < MSTJ[0x14]) && (0 < MDCY[0][local_d0 + -1])) {
            if ((0 < MSTJ[0x32]) && ((IP != 2 && (PMAS[1][local_d0 + -1] < PARJ[0x5a])))) {
              iVar1 = this->K[1][KC + -1];
              if (iVar1 < 1) {
                iVar1 = -iVar1;
              }
              if (iVar1 != 0x137) goto LAB_001186a7;
            }
            this_00 = this;
            LUDECY(this,KC);
          }
LAB_001186a7:
          if (MSTJ[0x5b] < 1) {
            if (MSTJ[0x5b] < 0) {
              local_fc._8_4_ = -MSTJ[0x5b];
              LUSHOW(this,local_fc._8_4_,-3,this->P[4][KC + -1]);
              this_00 = this;
              LUPREP(this,local_fc._8_4_);
              MSTJ[0x5b] = 0;
            }
          }
          else {
            QMAX._4_4_ = MSTJ[0x5b];
            local_e8 = 0.0;
            _MFRAG = -(this->P[2][MSTJ[0x5b] + -1] + this->P[2][MSTJ[0x5b]]) *
                     (this->P[2][MSTJ[0x5b] + -1] + this->P[2][MSTJ[0x5b]]) +
                     -(this->P[1][MSTJ[0x5b] + -1] + this->P[1][MSTJ[0x5b]]) *
                     (this->P[1][MSTJ[0x5b] + -1] + this->P[1][MSTJ[0x5b]]) +
                     (this->P[3][MSTJ[0x5b] + -1] + this->P[3][MSTJ[0x5b]]) *
                     (this->P[3][MSTJ[0x5b] + -1] + this->P[3][MSTJ[0x5b]]) +
                     -((this->P[0][MSTJ[0x5b] + -1] + this->P[0][MSTJ[0x5b]]) *
                      (this->P[0][MSTJ[0x5b] + -1] + this->P[0][MSTJ[0x5b]]));
            pdVar3 = std::max<double>(&local_e8,(double *)&MFRAG);
            local_e0 = sqrt(*pdVar3);
            LUSHOW(this,QMAX._4_4_,QMAX._4_4_ + 1,local_e0);
            this_00 = this;
            LUPREP(this,QMAX._4_4_);
            MSTJ[0x5b] = 0;
          }
        }
        else if ((this->K[0][KC + -1] == 1) || (this->K[0][KC + -1] == 2)) {
          local_fc._4_4_ = MSTJ[0];
          if ((0 < MSTJ[0]) && (this->K[0][KC + -1] == 1)) {
            local_fc._4_4_ = 2;
          }
          if (((((1 < MSTJ[0x14]) && (this->K[0][KC + -1] == 2)) && (KC < this->N)) &&
              ((this->K[0][KC] == 1 && (this->K[2][KC] == this->K[2][KC + -1])))) &&
             ((0 < this->K[2][KC + -1] &&
              ((this->K[2][KC + -1] < KC &&
               (this_00 = this, iVar1 = LUCOMP(this,this->K[1][this->K[2][KC + -1] + -1]),
               KCHG[1][iVar1 + -1] == 0)))))) {
            local_fc._0_4_ = 1;
            this_00 = (sophia_interface *)local_fc;
            piVar4 = std::min<int>((int *)this_00,(int *)(local_fc + 4));
            local_fc._4_4_ = *piVar4;
          }
          if (local_fc._4_4_ == 1) {
            this_00 = this;
            LUSTRF(this,KC);
          }
          if (local_fc._4_4_ == 2) {
            this_00 = this;
            LUINDF(this,KC);
          }
          if ((local_fc._4_4_ == 2) && (this->K[0][KC + -1] == 1)) {
            I = 0;
          }
          if ((local_fc._4_4_ == 2) && ((MSTJ[2] < 1 || (MSTJ[2] % 5 == 0)))) {
            I = 0;
          }
        }
      }
      if ((MSTU[0x17] == 0) || (MSTU[0x14] < 2)) {
        if ((KC < this->N) && (this->N < (MSTU[3] + -0x14) - MSTU[0x1f])) {
          IP1._3_1_ = 1;
        }
        else if (KC < this->N) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&I_1,"LUEXEC: no more memory left in LUJETS",
                     (allocator *)((long)&J_1 + 3));
          LUERRM(this,0xb,(string *)&I_1);
          std::__cxx11::string::~string((string *)&I_1);
          this_00 = (sophia_interface *)((long)&J_1 + 3);
          std::allocator<char>::~allocator((allocator<char> *)this_00);
        }
      }
    } while ((IP1._3_1_ & 1) != 0);
    if ((IP == 1) && (0 < MSTJ[0x32])) {
      this_00 = this;
      LUBOEI(this,J);
      repeat150 = true;
    }
    if ((repeat150 & 1U) == 0) {
      for (local_128 = 0; iVar1 = (int)this_00, local_128 < this->N; local_128 = local_128 + 1) {
        if ((0 < this->K[0][local_128]) && (this->K[0][local_128] < 0xb)) {
          for (PDEV._4_4_ = 0; PDEV._4_4_ < 4; PDEV._4_4_ = PDEV._4_4_ + 1) {
            PS[PDEV._4_4_][0] = this->P[PDEV._4_4_][local_128] + PS[PDEV._4_4_][0];
          }
          this_00 = this;
          iVar1 = LUCHGE(this,this->K[1][local_128]);
          PS[5][0] = (double)iVar1 + PS[5][0];
        }
      }
      std::abs(iVar1);
      std::abs(iVar1);
      std::abs(iVar1);
      std::abs(iVar1);
      std::abs(iVar1);
      std::abs(iVar1);
      local_138 = (extraout_XMM0_Qa + extraout_XMM0_Qa_00 + extraout_XMM0_Qa_01 +
                  extraout_XMM0_Qa_02) / (extraout_XMM0_Qa_03 + 1.0 + extraout_XMM0_Qa_04);
      if ((I == 1) && (PARU[10] < local_138)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_158,"LUEXEC: four-momentum was not conserved",&local_159)
        ;
        LUERRM(this,0xf,(string *)local_158);
        std::__cxx11::string::~string(local_158);
        this_01 = (allocator<char> *)&local_159;
        std::allocator<char>::~allocator(this_01);
        iVar1 = (int)this_01;
      }
      if ((I == 1) && (std::abs(iVar1), 0.1 < extraout_XMM0_Qa_05)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_180,"LUEXEC: charge was not conserved",&local_181);
        LUERRM(this,0xf,(string *)local_180);
        std::__cxx11::string::~string(local_180);
        std::allocator<char>::~allocator((allocator<char> *)&local_181);
      }
      return;
    }
  } while( true );
}

Assistant:

void sophia_interface::LUEXEC() {
// Purpose: to administrate the fragmentation and decay chain.
    double PS[6][2] = {0.};

    // Initialize and reset.
    MSTU[23] = 0;
    if (MSTU[11] >= 1) LUERRM(-1, "LULIST(0), Method removed.");
    MSTU[30]++;
    MSTU[0] = 0;
    MSTU[1] = 0;
    MSTU[2] = 0;
    if (MSTU[16] <= 0) MSTU[89] = 0;
    int MCONS = 1;

    // Sum up momentum, energy and charge for starting entries.
    int NSAV = N;
    for (int I = 0; I < N; ++I) {
        if (K[0][I] <= 0 || K[0][I] > 10) continue;
        for (int J = 0; J < 4; ++J) {
            PS[J][0] += P[J][I];
        }
        PS[5][0] += LUCHGE(K[1][I]);
    }
    PARU[20] = PS[3][0];

    // Prepare system for subsequent fragmentation/decay.
    LUPREP(0);

    // Loop through jet fragmentation and particle decays.
    int MBE = 0;
    bool repeat140 = false;
    do {  // 140
        repeat140 = false;
        MBE++;
        int IP = 0;

        bool repeat150 = false;
        do {  // 150
            repeat150 = false;
            IP++;
            int KC = 0;
            if (K[0][IP - 1] > 0 && K[0][IP - 1] <= 10) KC = LUCOMP(K[1][IP - 1]);
            if (KC == 0) {
                // do nothing
            // Particle decay if unstable and allowed. Save long-lived particle
            // decays until second pass after Bose-Einstein effects.
            } else if (KCHG[1][KC - 1] == 0) {
                if (MSTJ[20] >= 1 && MDCY[0][KC - 1] >= 1 && (MSTJ[50] <= 0 || MBE == 2 || PMAS[1][KC - 1] >= PARJ[90] || std::abs(K[1][IP - 1]) == 311)) {
                    LUDECY(IP);
                }

                // Decay products may develop a shower.
                if (MSTJ[91] > 0) {
                    int IP1 = MSTJ[91];
                    double QMAX = std::sqrt(std::max(0., (P[3][IP1 - 1] + P[3][IP1]) * (P[3][IP1 - 1] + P[3][IP1]) - (P[0][IP1 - 1] + P[0][IP1]) * (P[0][IP1 - 1] + P[0][IP1]) - (P[1][IP1 - 1] + P[1][IP1]) * (P[1][IP1 - 1] + P[1][IP1]) - (P[2][IP1 - 1] + P[2][IP1]) * (P[2][IP1 - 1] + P[2][IP1])));
                    LUSHOW(IP1, IP1 + 1, QMAX);
                    LUPREP(IP1);
                    MSTJ[91] = 0;
                } else if (MSTJ[91] < 0) {
                    int IP1 = -MSTJ[91];
                    LUSHOW(IP1, -3, P[4][IP - 1]);
                    LUPREP(IP1);
                    MSTJ[91] = 0;
                }

            // Jet fragmentation: string or independent fragmentation.
            } else if (K[0][IP - 1] == 1 || K[0][IP - 1] == 2) {
                int MFRAG = MSTJ[0];
                if (MFRAG >= 1 && K[0][IP - 1] == 1) MFRAG = 2;
                if (MSTJ[20] >= 2 && K[0][IP - 1] == 2 && N > IP) {
                    if (K[0][IP] == 1 && K[2][IP] == K[2][IP - 1] && K[2][IP - 1] > 0 && K[2][IP - 1] < IP) {
                        if (KCHG[1][LUCOMP(K[1][K[2][IP - 1] - 1]) - 1] == 0) MFRAG = std::min(1, MFRAG);
                    }
                }

                if (MFRAG == 1) LUSTRF(IP);
                if (MFRAG == 2) LUINDF(IP);

                if (MFRAG == 2 && K[0][IP - 1] == 1) MCONS = 0;
                if (MFRAG == 2 && (MSTJ[2] <= 0 || MSTJ[2] % 5 == 0)) MCONS = 0;
            }

            // Loop back if enough space left in LUJETS and no error abort.
            if (MSTU[23] != 0 && MSTU[20] >= 2) {
                // do nothing
            } else if (IP < N && N < MSTU[3] - 20 - MSTU[31]) {
                repeat150 = true;
                continue;
            } else if (IP < N) {
                LUERRM(11, "LUEXEC: no more memory left in LUJETS");
            }
        } while (repeat150);  // 150

        // Include simple Bose-Einstein effect parametrization if desired.
        if (MBE == 1 && MSTJ[50] >= 1) {
            LUBOEI(NSAV);
            repeat140 = true;
            continue;
        }
    } while (repeat140);  // 140

    // Check that momentum, energy and charge were conserved.
    for (int I = 0; I < N; ++I) {
        if (K[0][I] <= 0 || K[0][I] > 10) continue;
        for (int J = 0; J < 4; ++J) {
            PS[J][1] += P[J][I];
        }
        PS[5][1] += LUCHGE(K[1][I]);
    }
    double PDEV = (std::abs(PS[0][1] - PS[0][0]) + std::abs(PS[1][1] - PS[1][0]) + std::abs(PS[2][1] - PS[2][0]) + std::abs(PS[3][1] - PS[3][0])) / (1. + std::abs(PS[3][1]) + std::abs(PS[3][0]));
    if (MCONS == 1 && PDEV > PARU[10]) LUERRM(15, "LUEXEC: four-momentum was not conserved");
    if (MCONS == 1 && std::abs(PS[5][1] - PS[5][0]) > 0.1) LUERRM(15, "LUEXEC: charge was not conserved");
    return;
}